

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SpecparamSymbol::serializeTo(SpecparamSymbol *this,ASTSerializer *serializer)

{
  ConstantValue *pCVar1;
  Symbol *pSVar2;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,0xb,"isPathPulse",(ulong)this->isPathPulse);
  if (this->isPathPulse != true) {
    pCVar1 = getValue(this,(SourceRange)ZEXT816(0));
    ASTSerializer::write(serializer,5,"value",(size_t)pCVar1);
    return;
  }
  pCVar1 = getPulseRejectLimit(this);
  ASTSerializer::write(serializer,0xb,"rejectLimit",(size_t)pCVar1);
  pCVar1 = getPulseErrorLimit(this);
  ASTSerializer::write(serializer,10,"errorLimit",(size_t)pCVar1);
  pSVar2 = getPathSource(this);
  if (pSVar2 != (Symbol *)0x0) {
    name._M_str = "pathSource";
    name._M_len = 10;
    ASTSerializer::writeLink(serializer,name,pSVar2);
  }
  pSVar2 = getPathDest(this);
  if (pSVar2 != (Symbol *)0x0) {
    name_00._M_str = "pathDest";
    name_00._M_len = 8;
    ASTSerializer::writeLink(serializer,name_00,pSVar2);
    return;
  }
  return;
}

Assistant:

void SpecparamSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isPathPulse", isPathPulse);
    if (isPathPulse) {
        serializer.write("rejectLimit", getPulseRejectLimit());
        serializer.write("errorLimit", getPulseErrorLimit());
        if (auto symbol = getPathSource())
            serializer.writeLink("pathSource", *symbol);
        if (auto symbol = getPathDest())
            serializer.writeLink("pathDest", *symbol);
    }
    else {
        serializer.write("value", getValue());
    }
}